

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::sampleLinear1DCompare
                (ConstPixelBufferAccess *access,Sampler *sampler,float ref,float u,IVec2 *offset,
                bool isFixedPointDepthFormat)

{
  bool bVar1;
  int iVar2;
  deInt32 dVar3;
  int iVar4;
  int x;
  TextureFormat *pTVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  byte local_79;
  byte local_71;
  float p1;
  float p0;
  Vec4 p1Clr;
  Vec4 p0Clr;
  bool i1UseBorder;
  bool i0UseBorder;
  float a;
  int i1;
  int i0;
  int x1;
  int x0;
  int w;
  bool isFixedPointDepthFormat_local;
  IVec2 *offset_local;
  float u_local;
  float ref_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar2 = ConstPixelBufferAccess::getWidth(access);
  dVar3 = deFloorFloatToInt32(u - 0.5);
  iVar4 = Vector<int,_2>::x(offset);
  x = wrap(sampler->wrapS,dVar3 + iVar4,iVar2);
  iVar4 = wrap(sampler->wrapS,dVar3 + iVar4 + 1,iVar2);
  fVar6 = deFloatFrac(u - 0.5);
  local_71 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x,0,iVar2);
    local_71 = bVar1 ^ 0xff;
  }
  local_79 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar4,0,iVar2);
    local_79 = bVar1 ^ 0xff;
  }
  if ((local_71 & 1) == 0) {
    iVar2 = Vector<int,_2>::y(offset);
    lookup((tcu *)(p1Clr.m_data + 2),access,x,iVar2,0);
  }
  else {
    pTVar5 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p1Clr.m_data + 2),pTVar5,sampler);
  }
  if ((local_79 & 1) == 0) {
    iVar2 = Vector<int,_2>::y(offset);
    lookup((tcu *)&p1,access,iVar4,iVar2,0);
  }
  else {
    pTVar5 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)&p1,pTVar5,sampler);
  }
  fVar7 = execCompare((Vec4 *)(p1Clr.m_data + 2),sampler->compare,sampler->compareChannel,ref,
                      isFixedPointDepthFormat);
  fVar8 = execCompare((Vec4 *)&p1,sampler->compare,sampler->compareChannel,ref,
                      isFixedPointDepthFormat);
  return fVar7 * (1.0 - fVar6) + fVar8 * fVar6;
}

Assistant:

static float sampleLinear1DCompare (const ConstPixelBufferAccess& access, const Sampler& sampler, float ref, float u, const IVec2& offset, bool isFixedPointDepthFormat)
{
	int w = access.getWidth();

	int x0 = deFloorFloatToInt32(u-0.5f)+offset.x();
	int x1 = x0+1;

	int i0 = wrap(sampler.wrapS, x0, w);
	int i1 = wrap(sampler.wrapS, x1, w);

	float a = deFloatFrac(u-0.5f);

	bool i0UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i0, 0, w);
	bool i1UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i1, 0, w);

	// Border color for out-of-range coordinates if using CLAMP_TO_BORDER, otherwise execute lookups.
	Vec4 p0Clr = i0UseBorder  ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, offset.y(), 0);
	Vec4 p1Clr = i1UseBorder  ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, offset.y(), 0);

	// Execute comparisons.
	float p0 = execCompare(p0Clr, sampler.compare, sampler.compareChannel, ref, isFixedPointDepthFormat);
	float p1 = execCompare(p1Clr, sampler.compare, sampler.compareChannel, ref, isFixedPointDepthFormat);

	// Interpolate.
	return (p0 * (1.0f - a)) + (p1 * a);
}